

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_decode_v2(opj_codec_t *p_info,opj_stream_t *cio,opj_image_t *p_image)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  opj_stream_private_t *l_cio;
  opj_codec_private_t *l_info;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI + 8))
                        (*(undefined8 *)(in_RDI + 0x50),in_RSI,in_RDX,*(undefined8 *)(in_RDI + 0x58)
                        );
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_decode_v2(opj_codec_t *p_info,
									opj_stream_t *cio,
									opj_image_t* p_image)
{
	if (p_info && cio) {
		opj_codec_private_t * l_info = (opj_codec_private_t *) p_info;
		opj_stream_private_t * l_cio = (opj_stream_private_t *) cio;

		if (! l_info->is_decompressor) {
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_decode(	l_info->m_codec,
																l_cio,
																p_image,
																l_info->m_event_mgr);
	}

	return OPJ_FALSE;
}